

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O0

Token __thiscall flow::lang::Lexer::parseRegExpGroup(Lexer *this)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  Lexer *this_local;
  
  nextChar(this,true);
  std::__cxx11::string::clear();
  this->numberValue_ = 0;
  while( true ) {
    bVar1 = eof(this);
    bVar3 = false;
    if (!bVar1) {
      iVar2 = currentChar(this);
      iVar2 = isdigit(iVar2);
      bVar3 = iVar2 != 0;
    }
    if (!bVar3) break;
    this->numberValue_ = this->numberValue_ * 10;
    iVar2 = currentChar(this);
    this->numberValue_ = (long)(iVar2 + -0x30) + this->numberValue_;
    iVar2 = currentChar(this);
    std::__cxx11::string::operator+=((string *)&this->stringValue_,(char)iVar2);
    nextChar(this,true);
  }
  return RegExpGroup;
}

Assistant:

Token Lexer::parseRegExpGroup() {
  nextChar(); // skip leading '$'

  stringValue_.clear();
  numberValue_ = 0;

  while (!eof() && std::isdigit(currentChar())) {
    numberValue_ *= 10;
    numberValue_ += currentChar() - '0';
    stringValue_ += static_cast<char>(currentChar());
    nextChar();
  }

  return Token::RegExpGroup;
}